

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

size_t __thiscall player_t::PropagateMark(player_t *this)

{
  GC::Mark<APlayerPawn>(&this->mo);
  GC::Mark((DObject **)&this->poisoner);
  GC::Mark((DObject **)&this->attacker);
  GC::Mark((DObject **)&this->camera);
  GC::Mark((DObject **)&this->Bot);
  GC::Mark<AWeapon>(&this->ReadyWeapon);
  GC::Mark((DObject **)&this->ConversationNPC);
  GC::Mark((DObject **)&this->ConversationPC);
  GC::Mark((DObject **)&this->MUSINFOactor);
  GC::Mark((DObject **)&this->PremorphWeapon);
  GC::Mark((DObject **)&this->psprites);
  if (this->PendingWeapon != (AWeapon *)AWeapon::RegistrationInfo.MyClass) {
    GC::Mark<AWeapon>(&this->PendingWeapon);
  }
  return 0x2a0;
}

Assistant:

size_t player_t::PropagateMark()
{
	GC::Mark(mo);
	GC::Mark(poisoner);
	GC::Mark(attacker);
	GC::Mark(camera);
	GC::Mark(Bot);
	GC::Mark(ReadyWeapon);
	GC::Mark(ConversationNPC);
	GC::Mark(ConversationPC);
	GC::Mark(MUSINFOactor);
	GC::Mark(PremorphWeapon);
	GC::Mark(psprites);
	if (PendingWeapon != WP_NOCHANGE)
	{
		GC::Mark(PendingWeapon);
	}
	return sizeof(*this);
}